

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitAndOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar8 = 0;
      uVar4 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = uVar4 + 0x40;
          if (count <= uVar4 + 0x40) {
            uVar5 = count;
          }
LAB_0189da58:
          uVar11 = uVar4;
          if (uVar4 < uVar5) {
            bVar9 = *state;
            uVar10 = *(ulong *)(state + 8);
            do {
              uVar11 = *(ulong *)(pdVar2 + uVar4 * 8);
              if ((bVar9 & 1) == 0) {
                *state = '\x01';
                bVar9 = 1;
              }
              else {
                uVar11 = uVar10 & uVar11;
              }
              uVar4 = uVar4 + 1;
              uVar10 = uVar11;
            } while (uVar5 != uVar4);
            *(ulong *)(state + 8) = uVar11;
            uVar11 = uVar5;
          }
        }
        else {
          uVar10 = puVar1[uVar8];
          uVar5 = uVar4 + 0x40;
          if (count <= uVar4 + 0x40) {
            uVar5 = count;
          }
          if (uVar10 == 0xffffffffffffffff) goto LAB_0189da58;
          uVar11 = uVar5;
          if ((uVar10 != 0) && (uVar11 = uVar4, uVar4 < uVar5)) {
            uVar12 = 0;
            do {
              if ((uVar10 >> (uVar12 & 0x3f) & 1) != 0) {
                uVar11 = *(ulong *)(pdVar2 + uVar12 * 8 + uVar4 * 8);
                if (*state == '\0') {
                  *(ulong *)(state + 8) = uVar11;
                  *state = '\x01';
                }
                else {
                  *(ulong *)(state + 8) = *(ulong *)(state + 8) & uVar11;
                }
              }
              uVar12 = uVar12 + 1;
              uVar11 = uVar5;
            } while (uVar5 - uVar4 != uVar12);
          }
        }
        uVar8 = uVar8 + 1;
        uVar4 = uVar11;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      uVar4 = *(ulong *)input->data;
      if (*state == '\0') {
        *state = '\x01';
      }
      else {
        uVar4 = uVar4 & *(ulong *)(state + 8);
      }
      *(ulong *)(state + 8) = uVar4;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_68.sel)->sel_vector;
        bVar9 = *state;
        iVar6 = 0;
        uVar4 = *(ulong *)(state + 8);
        do {
          iVar7 = iVar6;
          if (psVar3 != (sel_t *)0x0) {
            iVar7 = (idx_t)psVar3[iVar6];
          }
          uVar8 = *(ulong *)(local_68.data + iVar7 * 8);
          if ((bVar9 & 1) == 0) {
            *state = '\x01';
            bVar9 = 1;
          }
          else {
            uVar8 = uVar4 & uVar8;
          }
          iVar6 = iVar6 + 1;
          uVar4 = uVar8;
        } while (count != iVar6);
        *(ulong *)(state + 8) = uVar8;
      }
    }
    else if (count != 0) {
      psVar3 = (local_68.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar3[iVar6];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            *(ulong *)(state + 8) = *(ulong *)(local_68.data + iVar7 * 8);
            *state = '\x01';
          }
          else {
            *(ulong *)(state + 8) = *(ulong *)(state + 8) & *(ulong *)(local_68.data + iVar7 * 8);
          }
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}